

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_inflatev(ucvector *out,uchar *in,size_t insize,LodePNGDecompressSettings *settings)

{
  uint btype;
  uint local_64;
  uint BTYPE;
  uint error;
  LodePNGBitReader reader;
  uint BFINAL;
  LodePNGDecompressSettings *settings_local;
  size_t insize_local;
  uchar *in_local;
  ucvector *out_local;
  
  reader._36_4_ = 0;
  local_64 = LodePNGBitReader_init((LodePNGBitReader *)&BTYPE,in,insize);
  out_local._4_4_ = local_64;
  if (local_64 == 0) {
    do {
      if (reader._36_4_ != 0) break;
      if (reader.size - reader.bitsize < 3) {
        return 0x34;
      }
      ensureBits9((LodePNGBitReader *)&BTYPE,3);
      reader._36_4_ = readBits((LodePNGBitReader *)&BTYPE,1);
      btype = readBits((LodePNGBitReader *)&BTYPE,2);
      if (btype == 3) {
        return 0x14;
      }
      if (btype == 0) {
        local_64 = inflateNoCompression(out,(LodePNGBitReader *)&BTYPE,settings);
      }
      else {
        local_64 = inflateHuffmanBlock(out,(LodePNGBitReader *)&BTYPE,btype,
                                       settings->max_output_size);
      }
      if (((local_64 == 0) && (settings->max_output_size != 0)) &&
         (settings->max_output_size < out->size)) {
        local_64 = 0x6d;
      }
    } while (local_64 == 0);
    out_local._4_4_ = local_64;
  }
  return out_local._4_4_;
}

Assistant:

static unsigned lodepng_inflatev(ucvector* out,
                                 const unsigned char* in, size_t insize,
                                 const LodePNGDecompressSettings* settings) {
  unsigned BFINAL = 0;
  LodePNGBitReader reader;
  unsigned error = LodePNGBitReader_init(&reader, in, insize);

  if(error) return error;

  while(!BFINAL) {
    unsigned BTYPE;
    if(reader.bitsize - reader.bp < 3) return 52; /*error, bit pointer will jump past memory*/
    ensureBits9(&reader, 3);
    BFINAL = readBits(&reader, 1);
    BTYPE = readBits(&reader, 2);

    if(BTYPE == 3) return 20; /*error: invalid BTYPE*/
    else if(BTYPE == 0) error = inflateNoCompression(out, &reader, settings); /*no compression*/
    else error = inflateHuffmanBlock(out, &reader, BTYPE, settings->max_output_size); /*compression, BTYPE 01 or 10*/
    if(!error && settings->max_output_size && out->size > settings->max_output_size) error = 109;
    if(error) break;
  }

  return error;
}